

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O0

void Assimp::IFC::CleanupWindowContour(ProjectedWindowContour *window)

{
  pointer this;
  bool bVar1;
  size_type sVar2;
  reference poly;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  IntPoint local_160;
  reference local_150;
  IfcVector2 *pip;
  iterator __end2;
  iterator __begin2;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *__range2;
  ExPolygons clipped;
  undefined1 local_108 [8];
  Clipper clipper;
  Polygon subject;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *contour;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> scratch;
  ProjectedWindowContour *window_local;
  
  scratch.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)window;
  std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::vector
            ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)&contour);
  this = scratch.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
            ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
             &clipper.field_0xb8);
  ClipperLib::Clipper::Clipper((Clipper *)local_108);
  std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::vector
            ((vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_> *)&__range2);
  __end2 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::begin
                     ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)this);
  pip = (IfcVector2 *)
        std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::end
                  ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                                *)&pip);
    if (!bVar1) break;
    local_150 = __gnu_cxx::
                __normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                ::operator*(&__end2);
    dVar6 = local_150->x * 1518500249.0;
    uVar4 = (ulong)dVar6;
    dVar5 = local_150->y * 1518500249.0;
    uVar3 = (ulong)dVar5;
    ClipperLib::IntPoint::IntPoint
              (&local_160,uVar4 | (long)(dVar6 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f,
               uVar3 | (long)(dVar5 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f);
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
              ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
               &clipper.field_0xb8,&local_160);
    __gnu_cxx::
    __normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
    ::operator++(&__end2);
  }
  ClipperLib::ClipperBase::AddPolygon
            ((ClipperBase *)(local_108 + (long)*(_func_int **)((long)local_108 + -0x18)),
             (Polygon *)&clipper.field_0xb8,ptSubject);
  ClipperLib::Clipper::Execute
            ((Clipper *)local_108,ctUnion,(ExPolygons *)&__range2,pftNonZero,pftNonZero);
  sVar2 = std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::size
                    ((vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_> *)
                     &__range2);
  if (sVar2 != 1) {
    bVar1 = std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::empty
                      ((vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_> *)
                       &__range2);
    if (bVar1) {
      LogFunctions<Assimp::IFCImporter>::LogError
                ("error during polygon clipping, window contour is degenerate");
      ProjectedWindowContour::FlagInvalid
                ((ProjectedWindowContour *)
                 scratch.
                 super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      goto LAB_0080290e;
    }
    LogFunctions<Assimp::IFCImporter>::LogError
              ("error during polygon clipping, window contour is not convex");
  }
  poly = std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::operator[]
                   ((vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_> *)
                    &__range2,0);
  ExtractVerticesFromClipper
            (&poly->outer,
             (vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)&contour,false);
LAB_0080290e:
  std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::~vector
            ((vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_> *)&__range2);
  ClipperLib::Clipper::~Clipper((Clipper *)local_108);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector
            ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
             &clipper.field_0xb8);
  std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::~vector
            ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)&contour);
  return;
}

Assistant:

void CleanupWindowContour(ProjectedWindowContour& window)
{
    std::vector<IfcVector2> scratch;
    std::vector<IfcVector2>& contour = window.contour;

    ClipperLib::Polygon subject;
    ClipperLib::Clipper clipper;
    ClipperLib::ExPolygons clipped;

    for(const IfcVector2& pip : contour) {
        subject.push_back(ClipperLib::IntPoint(  to_int64(pip.x), to_int64(pip.y) ));
    }

    clipper.AddPolygon(subject,ClipperLib::ptSubject);
    clipper.Execute(ClipperLib::ctUnion,clipped,ClipperLib::pftNonZero,ClipperLib::pftNonZero);

    // This should yield only one polygon or something went wrong
    if (clipped.size() != 1) {

        // Empty polygon? drop the contour altogether
        if(clipped.empty()) {
            IFCImporter::LogError("error during polygon clipping, window contour is degenerate");
            window.FlagInvalid();
            return;
        }

        // Else: take the first only
        IFCImporter::LogError("error during polygon clipping, window contour is not convex");
    }

    ExtractVerticesFromClipper(clipped[0].outer, scratch);
    // Assume the bounding box doesn't change during this operation
}